

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

void __thiscall HttpRequest::parseMethod(HttpRequest *this,char *method)

{
  int iVar1;
  MethodType MVar2;
  char **ppcVar3;
  uint32_t i;
  long lVar4;
  
  ppcVar3 = gMethodTypeList;
  lVar4 = 0;
  MVar2 = kMethodUnknown;
  do {
    if (lVar4 == 8) {
LAB_0011a6d5:
      this->mMethod = MVar2;
      return;
    }
    iVar1 = strcmp(method,*ppcVar3);
    if (iVar1 == 0) {
      MVar2 = (MethodType)lVar4;
      goto LAB_0011a6d5;
    }
    lVar4 = lVar4 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while( true );
}

Assistant:

void HttpRequest::parseMethod( const char *method )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	for ( uint32_t i = 0; i < JH_ARRAY_SIZE( gMethodTypeList ); i++ )
	{
		//LOG_NOISE( "matching %s", gMethodTypeList[ i ] );
		if ( strcmp( method, gMethodTypeList[ i ] ) == 0 )
		{
			mMethod = (MethodType)i;
			LOG( "Found method %s", gMethodTypeList[ mMethod ] );
			return;
		}
	}
	
	LOG( "Failed to match method \"%s\"", method );
	mMethod = kMethodUnknown;
}